

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_lite.cc
# Opt level: O2

string * __thiscall
google::protobuf::internal::GetTypeUrl_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,string_view message_name,
          string_view type_url_prefix)

{
  AlphaNum local_b0;
  AlphaNum *local_80;
  size_t local_78;
  AlphaNum local_50;
  
  local_78 = type_url_prefix._M_len;
  local_80 = (AlphaNum *)message_name._M_str;
  if ((local_80 == (AlphaNum *)0x0) || (local_80->digits_[local_78 - 0x11] != '/')) {
    local_b0.piece_ = absl::lts_20250127::NullSafeStringView("/");
    local_50.piece_._M_len = (size_t)this;
    local_50.piece_._M_str = (char *)message_name._M_len;
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_80,&local_b0,&local_50,&local_b0);
  }
  else {
    local_b0.piece_._M_str = (char *)message_name._M_len;
    local_b0.piece_._M_len = (size_t)this;
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_80,&local_b0,local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetTypeUrl(absl::string_view message_name,
                       absl::string_view type_url_prefix) {
  if (!type_url_prefix.empty() &&
      type_url_prefix[type_url_prefix.size() - 1] == '/') {
    return absl::StrCat(type_url_prefix, message_name);
  } else {
    return absl::StrCat(type_url_prefix, "/", message_name);
  }
}